

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re3q3.cc
# Opt level: O2

void re3q3::rotation_to_3q3
               (Matrix<double,_3,_10,_0,_3,_10> *Rcoeffs,Matrix<double,_3,_10,_0,_3,_10> *coeffs)

{
  double dVar1;
  long lVar2;
  
  for (lVar2 = -0x18; lVar2 != 0; lVar2 = lVar2 + 8) {
    *(double *)
     ((long)(coeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.
            m_data.array + lVar2 + 0x18) =
         (*(double *)
           ((long)(Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).
                  m_storage.m_data.array + lVar2 + 0x18) -
         (*(double *)
           ((long)(Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).
                  m_storage.m_data.array + lVar2 + 0x78) +
         *(double *)
          ((long)(Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage
                 .m_data.array + lVar2 + 0xd8))) +
         *(double *)
          ((long)Rcoeffs[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage
                 .m_data.array + lVar2);
    dVar1 = *(double *)
             ((long)(Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).
                    m_storage.m_data.array + lVar2 + 0x60) +
            *(double *)
             ((long)(Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).
                    m_storage.m_data.array + lVar2 + 0x30);
    *(double *)
     ((long)(coeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.
            m_data.array + lVar2 + 0x30) = dVar1 + dVar1;
    dVar1 = *(double *)
             ((long)(Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).
                    m_storage.m_data.array + lVar2 + 0xa8) +
            *(double *)
             ((long)(Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).
                    m_storage.m_data.array + lVar2 + 0x48);
    *(double *)
     ((long)(coeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.
            m_data.array + lVar2 + 0x48) = dVar1 + dVar1;
    *(double *)
     ((long)(coeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.
            m_data.array + lVar2 + 0x60) =
         (*(double *)
           ((long)(Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).
                  m_storage.m_data.array + lVar2 + 0x78) -
         (*(double *)
           ((long)(Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).
                  m_storage.m_data.array + lVar2 + 0x18) +
         *(double *)
          ((long)(Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage
                 .m_data.array + lVar2 + 0xd8))) +
         *(double *)
          ((long)Rcoeffs[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage
                 .m_data.array + lVar2);
    dVar1 = *(double *)
             ((long)(Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).
                    m_storage.m_data.array + lVar2 + 0xc0) +
            *(double *)
             ((long)(Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).
                    m_storage.m_data.array + lVar2 + 0x90);
    *(double *)
     ((long)(coeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.
            m_data.array + lVar2 + 0x78) = dVar1 + dVar1;
    *(double *)
     ((long)(coeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.
            m_data.array + lVar2 + 0x90) =
         (*(double *)
           ((long)(Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).
                  m_storage.m_data.array + lVar2 + 0xd8) -
         (*(double *)
           ((long)(Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).
                  m_storage.m_data.array + lVar2 + 0x78) +
         *(double *)
          ((long)(Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage
                 .m_data.array + lVar2 + 0x18))) +
         *(double *)
          ((long)Rcoeffs[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage
                 .m_data.array + lVar2);
    dVar1 = *(double *)
             ((long)(Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).
                    m_storage.m_data.array + lVar2 + 0x90) -
            *(double *)
             ((long)(Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).
                    m_storage.m_data.array + lVar2 + 0xc0);
    *(double *)
     ((long)(coeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.
            m_data.array + lVar2 + 0xa8) = dVar1 + dVar1;
    dVar1 = *(double *)
             ((long)(Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).
                    m_storage.m_data.array + lVar2 + 0xa8) -
            *(double *)
             ((long)(Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).
                    m_storage.m_data.array + lVar2 + 0x48);
    *(double *)
     ((long)(coeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.
            m_data.array + lVar2 + 0xc0) = dVar1 + dVar1;
    dVar1 = *(double *)
             ((long)(Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).
                    m_storage.m_data.array + lVar2 + 0x30) -
            *(double *)
             ((long)(Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).
                    m_storage.m_data.array + lVar2 + 0x60);
    *(double *)
     ((long)(coeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.
            m_data.array + lVar2 + 0xd8) = dVar1 + dVar1;
    *(double *)
     ((long)coeffs[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
            m_data.array + lVar2) =
         *(double *)
          ((long)(Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage
                 .m_data.array + lVar2 + 0x78) +
         *(double *)
          ((long)(Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage
                 .m_data.array + lVar2 + 0x18) +
         *(double *)
          ((long)(Rcoeffs->super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage
                 .m_data.array + lVar2 + 0xd8) +
         *(double *)
          ((long)Rcoeffs[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage
                 .m_data.array + lVar2);
  }
  return;
}

Assistant:

void rotation_to_3q3(const Eigen::Matrix<double, 3, 10> &Rcoeffs, Eigen::Matrix<double, 3, 10> *coeffs) {
    for (int k = 0; k < 3; k++) {
        (*coeffs)(k, 0) = Rcoeffs(k, 0) - Rcoeffs(k, 4) - Rcoeffs(k, 8) + Rcoeffs(k, 9);
        (*coeffs)(k, 1) = 2 * Rcoeffs(k, 1) + 2 * Rcoeffs(k, 3);
        (*coeffs)(k, 2) = 2 * Rcoeffs(k, 2) + 2 * Rcoeffs(k, 6);
        (*coeffs)(k, 3) = Rcoeffs(k, 4) - Rcoeffs(k, 0) - Rcoeffs(k, 8) + Rcoeffs(k, 9);
        (*coeffs)(k, 4) = 2 * Rcoeffs(k, 5) + 2 * Rcoeffs(k, 7);
        (*coeffs)(k, 5) = Rcoeffs(k, 8) - Rcoeffs(k, 4) - Rcoeffs(k, 0) + Rcoeffs(k, 9);
        (*coeffs)(k, 6) = 2 * Rcoeffs(k, 5) - 2 * Rcoeffs(k, 7);
        (*coeffs)(k, 7) = 2 * Rcoeffs(k, 6) - 2 * Rcoeffs(k, 2);
        (*coeffs)(k, 8) = 2 * Rcoeffs(k, 1) - 2 * Rcoeffs(k, 3);
        (*coeffs)(k, 9) = Rcoeffs(k, 0) + Rcoeffs(k, 4) + Rcoeffs(k, 8) + Rcoeffs(k, 9);
    }
}